

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

void __thiscall czh::lexer::Lexer::check_token(Lexer *this,Token *token)

{
  Match *this_00;
  State SVar1;
  TokenType TVar2;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  TVar2 = token->type;
  if (TVar2 == FEND) {
    SVar1 = (this->match).state;
    if (SVar1 == INIT) {
      return;
    }
    if (SVar1 == END) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"Unexpected end of file.",(allocator<char> *)&local_b8);
    czh::token::Token::report_error(token,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    TVar2 = token->type;
  }
  this_00 = &this->match;
  if (((this->match).state == END) && (TVar2 != SEND)) {
    local_d8._M_dataplus._M_p._0_4_ = 9;
    Match::match(this_00,(TokenType *)&local_d8);
  }
  Match::match(this_00,&token->type);
  if (this_00->state == UNEXPECTED) {
    czh::token::Token::to_string_abi_cxx11_(&local_38,token);
    std::operator+(&local_78,"Unexpected token \'",&local_38);
    std::operator+(&local_58,&local_78,"\'.Do you mean \'");
    Match::error_correct_abi_cxx11_(&local_98,this_00);
    std::operator+(&local_b8,&local_58,&local_98);
    std::operator+(&local_d8,&local_b8,"\'?");
    czh::token::Token::report_error(token,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void check_token(const token::Token &token)
    {
      if (token.type == token::TokenType::FEND)
      {
        if (match.get_state() == State::END || match.get_state() == State::INIT)
          return;
        else
          token.report_error("Unexpected end of file.");
      }
      if (match.end() && token.type != token::TokenType::SEND)
        match.match(token::TokenType::SEND);
      match.match(token.type);
      if (!match.good())
      {
        token.report_error("Unexpected token '" + token.to_string() + "'.Do you mean '"
                           + match.error_correct() + "'?");
      }
    }